

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

_Bool clone_bytes(uchar **dst,uchar *src,size_t len)

{
  uchar *puVar1;
  size_t len_local;
  uchar *src_local;
  uchar **dst_local;
  
  if (len == 0) {
    *dst = (uchar *)0x0;
    dst_local._7_1_ = true;
  }
  else {
    puVar1 = (uchar *)wally_malloc(len);
    *dst = puVar1;
    if (*dst != (uchar *)0x0) {
      memcpy(*dst,src,len);
    }
    dst_local._7_1_ = *dst != (uchar *)0x0;
  }
  return dst_local._7_1_;
}

Assistant:

bool clone_bytes(unsigned char **dst, const unsigned char *src, size_t len)
{
    if (!len) {
        *dst = NULL;
        return true;
    }
    *dst = wally_malloc(len);
    if (*dst)
        memcpy(*dst, src, len);
    return *dst != NULL;
}